

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

Interval * __thiscall
tcu::FloatFormat::roundOut
          (Interval *__return_storage_ptr__,FloatFormat *this,Interval *x,bool roundUnderOverflow)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  bVar1 = x->m_hasNaN;
  __return_storage_ptr__->m_hasNaN = bVar1;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar5 = x->m_lo;
  if (dVar5 < x->m_hi || dVar5 == x->m_hi) {
    dVar5 = roundOut(this,dVar5,false,roundUnderOverflow);
    dVar6 = roundOut(this,x->m_hi,true,roundUnderOverflow);
    __return_storage_ptr__->m_hasNaN = (bool)((NAN(dVar5) || NAN(dVar6)) | bVar1);
    uVar3 = -(ulong)NAN(dVar6);
    uVar4 = -(ulong)NAN(dVar5);
    dVar9 = (double)(uVar3 & 0x7ff0000000000000 | ~uVar3 & (ulong)dVar6);
    dVar10 = (double)(uVar4 & 0xfff0000000000000 | ~uVar4 & (ulong)dVar5);
    auVar8._0_8_ = uVar3 & 0xfff0000000000000;
    auVar8._8_8_ = uVar4 & 0x7ff0000000000000;
    auVar2._8_8_ = ~uVar4 & (ulong)dVar5;
    auVar2._0_8_ = ~uVar3 & (ulong)dVar6;
    auVar8 = auVar8 | auVar2;
    auVar7._0_8_ = auVar8._8_8_;
    auVar7._8_4_ = auVar8._0_4_;
    auVar7._12_4_ = auVar8._4_4_;
    uVar3 = -(ulong)(auVar7._0_8_ <= dVar9);
    uVar4 = -(ulong)(auVar7._8_8_ <= dVar10);
    dVar5 = (double)(~uVar3 & (ulong)dVar9 | (ulong)auVar7._0_8_ & uVar3);
    dVar6 = (double)(~uVar4 & auVar8._0_8_ | (ulong)dVar10 & uVar4);
    uVar3 = -(ulong)(INFINITY <= dVar5);
    uVar4 = -(ulong)(dVar6 <= -INFINITY);
    __return_storage_ptr__->m_lo = (double)(~uVar3 & (ulong)dVar5 | uVar3 & 0x7ff0000000000000);
    __return_storage_ptr__->m_hi = (double)(~uVar4 & (ulong)dVar6 | uVar4 & 0xfff0000000000000);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::roundOut (const Interval& x, bool roundUnderOverflow) const
{
	Interval ret = x.nan();

	if (!x.empty())
		ret |= Interval(roundOut(x.lo(), false, roundUnderOverflow),
						roundOut(x.hi(), true, roundUnderOverflow));

	return ret;
}